

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-knowledge.c
# Opt level: O3

_Bool object_has_rune(object *obj,wchar_t rune_no)

{
  byte bVar1;
  short sVar2;
  _Bool *p_Var3;
  object_kind *poVar4;
  rune *prVar5;
  _Bool _Var6;
  int iVar7;
  angband_constants *paVar8;
  char **ppcVar9;
  ulong uVar10;
  
  prVar5 = rune_list;
  switch(rune_list[rune_no].variety) {
  case RUNE_VAR_COMBAT:
    iVar7 = rune_list[rune_no].index;
    if (iVar7 == 1) {
      _Var6 = object_has_standard_to_h(obj);
      if (!_Var6) {
        return true;
      }
      iVar7 = prVar5[rune_no].index;
    }
    else if (iVar7 == 0) {
      sVar2 = obj->to_a;
      goto joined_r0x001a363f;
    }
    if (iVar7 == 3) {
      if (((obj->kind != (object_kind *)0x0) && (_Var6 = tval_is_body_armor(obj), _Var6)) &&
         (obj->kind->ac != (int)obj->ac)) {
        return true;
      }
    }
    else if ((iVar7 == 2) && (obj->to_d != 0)) {
      return true;
    }
    if ((prVar5[rune_no].index == 4) && (poVar4 = obj->kind, poVar4 != (object_kind *)0x0)) {
      if (poVar4->dd != (uint)obj->dd) {
        return true;
      }
      if (poVar4->ds != (uint)obj->ds) {
        return true;
      }
    }
    break;
  case RUNE_VAR_MOD:
    sVar2 = obj->modifiers[rune_list[rune_no].index];
joined_r0x001a363f:
    if (sVar2 != 0) {
      return true;
    }
    break;
  case RUNE_VAR_RESIST:
    if (obj->el_info[rune_list[rune_no].index].res_level != 100) {
      return true;
    }
    break;
  case RUNE_VAR_BRAND:
    p_Var3 = obj->brands;
    if ((p_Var3 != (_Bool *)0x0) && (bVar1 = z_info->brand_max, (ulong)bVar1 != 0)) {
      ppcVar9 = &brands->name;
      uVar10 = 0;
      do {
        if ((p_Var3[uVar10] == true) && (iVar7 = strcmp(*ppcVar9,prVar5[rune_no].name), iVar7 == 0))
        {
          return true;
        }
        uVar10 = uVar10 + 1;
        ppcVar9 = ppcVar9 + 6;
      } while (bVar1 != uVar10);
    }
    break;
  case RUNE_VAR_SLAY:
    if ((obj->slays != (_Bool *)0x0) && (z_info->slay_max != '\0')) {
      uVar10 = 0;
      paVar8 = z_info;
      do {
        if ((obj->slays[uVar10] == true) &&
           (_Var6 = same_monsters_slain(prVar5[rune_no].index,(wchar_t)uVar10), paVar8 = z_info,
           _Var6)) {
          return true;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < paVar8->slay_max);
    }
    break;
  case RUNE_VAR_CURSE:
    if ((obj->curses != (curse_data *)0x0) && (obj->curses[rune_list[rune_no].index].power != L'\0')
       ) {
      return true;
    }
    break;
  case RUNE_VAR_FLAG:
    _Var6 = flag_has_dbg(obj->flags,6,rune_list[rune_no].index,"obj->flags","r->index");
    if (_Var6) {
      return true;
    }
  }
  return false;
}

Assistant:

bool object_has_rune(const struct object *obj, int rune_no)
{
	struct rune *r = &rune_list[rune_no];

	switch (r->variety) {
		/* Combat runes - just check them all */
		case RUNE_VAR_COMBAT: {
			if ((r->index == COMBAT_RUNE_TO_A) && (obj->to_a))
				return true;
			else if ((r->index == COMBAT_RUNE_TO_H) &&
					 !object_has_standard_to_h(obj))
				return true;
			else if ((r->index == COMBAT_RUNE_TO_D) && (obj->to_d))
				return true;
			else if ((r->index == COMBAT_RUNE_AC) &&
					 !object_has_standard_ac(obj))
				return true;
			else if ((r->index == COMBAT_RUNE_DICE) &&
					 !object_has_standard_dice(obj))
				return true;
			break;
		}
		/* Mod runes */
		case RUNE_VAR_MOD: {
			if (obj->modifiers[r->index] != 0)
				return true;
			break;
		}
		/* Element runes */
		case RUNE_VAR_RESIST: {
			if (obj->el_info[r->index].res_level != RES_LEVEL_BASE)
				return true;
			break;
		}
		/* Brand runes */
		case RUNE_VAR_BRAND: {
			if (obj->brands) {
				int i;
				for (i = 0; i < z_info->brand_max; i++) {
					if (obj->brands[i] && streq(brands[i].name, r->name)) {
						return true;
					}
				}
			}
			break;
		}
		/* Slay runes */
		case RUNE_VAR_SLAY: {
			if (obj->slays) {
				int i;
				for (i = 0; i < z_info->slay_max; i++) {
					if (obj->slays[i] && same_monsters_slain(r->index, i)) {
						return true;
					}
				}
			}
			break;
		}
		/* Curse runes */
		case RUNE_VAR_CURSE: {
			if (obj->curses && obj->curses[r->index].power)
				return true;
			break;
		}
		/* Flag runes */
		case RUNE_VAR_FLAG: {
			if (of_has(obj->flags, r->index))
				return true;
			break;
		}
		default: break;
	}

	return false;
}